

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# can-calc-bit-timing-v6_3.c
# Opt level: O0

int can_calc_bittiming_v6_3
              (net_device *dev,can_bittiming *bt,can_bittiming_const *btc,netlink_ext_ack *extack)

{
  uint uVar1;
  __u32 _Var2;
  uint uVar3;
  netlink_ext_ack *in_RCX;
  can_bittiming_const *in_RDX;
  can_bittiming *in_RSI;
  net_device *in_RDI;
  uint32_t __rem_1;
  uint32_t __base_1;
  uint32_t __rem;
  uint32_t __base;
  int __x;
  int err;
  u64 v64;
  uint tseg2;
  uint tseg1;
  uint tseg;
  uint tsegall;
  uint brp;
  uint best_brp;
  uint best_tseg;
  uint sample_point_nominal;
  uint best_sample_point_error;
  uint sample_point_error;
  uint best_bitrate_error;
  uint bitrate_error;
  uint bitrate;
  can_priv *priv;
  uint local_98;
  uint local_64;
  uint local_60;
  uint local_5c;
  int local_58;
  uint local_54;
  uint local_50;
  uint local_4c;
  uint local_48;
  uint local_44;
  uint local_40;
  uint local_3c;
  uint local_38;
  uint local_34;
  uint *local_30;
  netlink_ext_ack *local_28;
  can_bittiming_const *local_20;
  can_bittiming *local_18;
  net_device *local_10;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = (uint *)netdev_priv(in_RDI);
  local_3c = 0xffffffff;
  local_44 = 0xffffffff;
  local_4c = 0;
  local_50 = 0;
  local_60 = 0;
  local_64 = 0;
  if (local_18->sample_point == 0) {
    if (local_18->bitrate < 0xc3501) {
      if (local_18->bitrate < 0x7a121) {
        local_48 = 0x36b;
      }
      else {
        local_48 = 800;
      }
    }
    else {
      local_48 = 0x2ee;
    }
  }
  else {
    local_48 = local_18->sample_point;
  }
  for (local_5c = (local_20->tseg1_max + local_20->tseg2_max) * 2 + 1;
      (local_20->tseg1_min + local_20->tseg2_min) * 2 <= local_5c; local_5c = local_5c - 1) {
    local_58 = (local_5c >> 1) + 1;
    local_54 = ((*local_30 / (local_58 * local_18->bitrate) + (local_5c & 1)) / local_20->brp_inc) *
               local_20->brp_inc;
    if ((local_20->brp_min <= local_54) && (local_54 <= local_20->brp_max)) {
      local_34 = *local_30 / (local_54 * local_58);
      local_98 = local_18->bitrate - local_34;
      if ((int)local_98 < 0) {
        local_98 = -local_98;
      }
      local_38 = local_98;
      if (local_98 <= local_3c) {
        if (local_98 < local_3c) {
          local_44 = 0xffffffff;
        }
        can_update_sample_point_v6_3(local_20,local_48,local_5c >> 1,&local_60,&local_64,&local_40);
        if (local_40 < local_44) {
          local_44 = local_40;
          local_3c = local_38;
          local_4c = local_5c >> 1;
          local_50 = local_54;
          if ((local_38 == 0) && (local_40 == 0)) break;
        }
      }
    }
  }
  if ((local_3c == 0) ||
     (local_38 = (uint)(((ulong)local_3c * 1000) / (ulong)local_18->bitrate), local_38 < 0x33)) {
    _Var2 = can_update_sample_point_v6_3(local_20,local_48,local_4c,&local_60,&local_64,(uint *)0x0)
    ;
    local_18->sample_point = _Var2;
    local_18->tq = (__u32)(((ulong)local_50 * 1000000000) / (ulong)*local_30);
    local_18->prop_seg = local_60 >> 1;
    local_18->phase_seg1 = local_60 - local_18->prop_seg;
    local_18->phase_seg2 = local_64;
    can_sjw_set_default(local_18);
    local_4 = can_sjw_check(local_10,local_18,local_20,local_28);
    if (local_4 == 0) {
      local_18->brp = local_50;
      uVar1 = *local_30;
      _Var2 = local_18->brp;
      uVar3 = can_bit_time(local_18);
      local_18->bitrate = uVar1 / (_Var2 * uVar3);
      local_4 = 0;
    }
  }
  else {
    local_4 = -0x16;
  }
  return local_4;
}

Assistant:

int can_calc_bittiming(const struct net_device *dev, struct can_bittiming *bt,
		       const struct can_bittiming_const *btc, struct netlink_ext_ack *extack)
{
	struct can_priv *priv = netdev_priv(dev);
	unsigned int bitrate;			/* current bitrate */
	unsigned int bitrate_error;		/* difference between current and nominal value */
	unsigned int best_bitrate_error = UINT_MAX;
	unsigned int sample_point_error;	/* difference between current and nominal value */
	unsigned int best_sample_point_error = UINT_MAX;
	unsigned int sample_point_nominal;	/* nominal sample point */
	unsigned int best_tseg = 0;		/* current best value for tseg */
	unsigned int best_brp = 0;		/* current best value for brp */
	unsigned int brp, tsegall, tseg, tseg1 = 0, tseg2 = 0;
	u64 v64;
	int err;

	/* Use CiA recommended sample points */
	if (bt->sample_point) {
		sample_point_nominal = bt->sample_point;
	} else {
		if (bt->bitrate > 800 * KILO /* BPS */)
			sample_point_nominal = 750;
		else if (bt->bitrate > 500 * KILO /* BPS */)
			sample_point_nominal = 800;
		else
			sample_point_nominal = 875;
	}

	/* tseg even = round down, odd = round up */
	for (tseg = (btc->tseg1_max + btc->tseg2_max) * 2 + 1;
	     tseg >= (btc->tseg1_min + btc->tseg2_min) * 2; tseg--) {
		tsegall = CAN_SYNC_SEG + tseg / 2;

		/* Compute all possible tseg choices (tseg=tseg1+tseg2) */
		brp = priv->clock.freq / (tsegall * bt->bitrate) + tseg % 2;

		/* choose brp step which is possible in system */
		brp = (brp / btc->brp_inc) * btc->brp_inc;
		if (brp < btc->brp_min || brp > btc->brp_max)
			continue;

		bitrate = priv->clock.freq / (brp * tsegall);
		bitrate_error = abs(bt->bitrate - bitrate);

		/* tseg brp biterror */
		if (bitrate_error > best_bitrate_error)
			continue;

		/* reset sample point error if we have a better bitrate */
		if (bitrate_error < best_bitrate_error)
			best_sample_point_error = UINT_MAX;

		can_update_sample_point(btc, sample_point_nominal, tseg / 2,
					&tseg1, &tseg2, &sample_point_error);
		if (sample_point_error >= best_sample_point_error)
			continue;

		best_sample_point_error = sample_point_error;
		best_bitrate_error = bitrate_error;
		best_tseg = tseg / 2;
		best_brp = brp;

		if (bitrate_error == 0 && sample_point_error == 0)
			break;
	}

	if (best_bitrate_error) {
		/* Error in one-tenth of a percent */
		v64 = (u64)best_bitrate_error * 1000;
		do_div(v64, bt->bitrate);
		bitrate_error = (u32)v64;
		if (bitrate_error > CAN_CALC_MAX_ERROR) {
			NL_SET_ERR_MSG_FMT(extack,
					   "bitrate error: %u.%u%% too high",
					   bitrate_error / 10, bitrate_error % 10);
			return -EINVAL;
		}
		NL_SET_ERR_MSG_FMT(extack,
				   "bitrate error: %u.%u%%",
				   bitrate_error / 10, bitrate_error % 10);
	}

	/* real sample point */
	bt->sample_point = can_update_sample_point(btc, sample_point_nominal,
						   best_tseg, &tseg1, &tseg2,
						   NULL);

	v64 = (u64)best_brp * 1000 * 1000 * 1000;
	do_div(v64, priv->clock.freq);
	bt->tq = (u32)v64;
	bt->prop_seg = tseg1 / 2;
	bt->phase_seg1 = tseg1 - bt->prop_seg;
	bt->phase_seg2 = tseg2;

	can_sjw_set_default(bt);

	err = can_sjw_check(dev, bt, btc, extack);
	if (err)
		return err;

	bt->brp = best_brp;

	/* real bitrate */
	bt->bitrate = priv->clock.freq /
		(bt->brp * can_bit_time(bt));

	return 0;
}